

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O3

void InstructionSet::M68k::Primitive::
     apply_sr_ccr<(InstructionSet::M68k::Operation)34,CPU::MC68000::ProcessorBase>
               (uint16_t source,Status *status,ProcessorBase *flow_controller)

{
  uint16_t uVar1;
  uint uVar2;
  
  uVar1 = Status::status(status);
  uVar2 = (uint)(uVar1 | source);
  status->carry_flag = (ulong)(uVar2 & 1);
  status->overflow_flag = (ulong)(uVar2 & 2);
  status->zero_result = (ulong)(~(uint)(uVar1 | source) & 4);
  status->negative_flag = (ulong)(uVar2 & 8);
  status->extend_flag = (ulong)(uVar2 & 0x10);
  return;
}

Assistant:

void apply_sr_ccr(uint16_t source, Status &status, FlowController &flow_controller) {
	static_assert(
		operation == Operation::ANDItoSR ||	operation == Operation::ANDItoCCR ||
		operation == Operation::EORItoSR ||	operation == Operation::EORItoCCR ||
		operation == Operation::ORItoSR ||	operation == Operation::ORItoCCR
	);

	auto sr = status.status();
	switch(operation) {
		case Operation::ANDItoSR:	case Operation::ANDItoCCR:
			sr &= source;
		break;
		case Operation::EORItoSR:	case Operation::EORItoCCR:
			sr ^= source;
		break;
		case Operation::ORItoSR:	case Operation::ORItoCCR:
			sr |= source;
		break;
	}

	switch(operation) {
		case Operation::ANDItoSR:
		case Operation::EORItoSR:
		case Operation::ORItoSR:
			status.set_status(sr);
			flow_controller.did_update_status();
		break;

		case Operation::ANDItoCCR:
		case Operation::EORItoCCR:
		case Operation::ORItoCCR:
			status.set_ccr(sr);
		break;
	}
}